

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O2

Vec_Int_t * Gia_ManGetTestPatterns(char *pFileName)

{
  uint uVar1;
  uint uVar2;
  FILE *__stream;
  Vec_Int_t *p;
  Vec_Int_t *vTests;
  Vec_Int_t *local_20;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open input file \"%s\".\n",pFileName);
    return (Vec_Int_t *)0x0;
  }
  p = Vec_IntAlloc(10000);
  local_20 = p;
LAB_0046789a:
  uVar2 = fgetc(__stream);
  uVar1 = uVar2 + 1;
  if (uVar1 < 0x22) goto code_r0x004678aa;
  goto LAB_004678b5;
code_r0x004678aa:
  if ((0x200004c00U >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
    if ((ulong)uVar1 == 0) goto LAB_00467902;
LAB_004678b5:
    if (uVar2 - 0x32 < 0xfffffffe) {
      printf("Wring symbol (%c) in the input file.\n",(ulong)uVar2);
      Vec_IntFreeP(&local_20);
      p = local_20;
LAB_00467902:
      fclose(__stream);
      return p;
    }
    Vec_IntPush(p,uVar2 - 0x30);
  }
  goto LAB_0046789a;
}

Assistant:

Vec_Int_t * Gia_ManGetTestPatterns( char * pFileName )
{
    FILE * pFile = fopen( pFileName, "rb" );
    Vec_Int_t * vTests; int c;
    if ( pFile == NULL )
    {
        printf( "Cannot open input file \"%s\".\n", pFileName );
        return NULL;
    }
    vTests = Vec_IntAlloc( 10000 );
    while ( (c = fgetc(pFile)) != EOF )
    {
        if ( c == ' ' || c == '\t' || c == '\r' || c == '\n' )
            continue;
        if ( c != '0' && c != '1' )
        {
            printf( "Wring symbol (%c) in the input file.\n", c );
            Vec_IntFreeP( &vTests );
            break;
        }
        Vec_IntPush( vTests, c - '0' );
    }
    fclose( pFile );
    return vTests;
}